

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O2

void __thiscall libsbox::Stream::use_pipe(Stream *this,Pipe *pipe)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"@",&pipe->name_);
  std::__cxx11::string::operator=((string *)this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Stream::use_pipe(const Pipe &pipe) {
    filename_ = "@" + pipe.get_name();
}